

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

void loader_impl_destroy_deallocate(loader_impl impl)

{
  set_iterate(impl->exec_path_map,loader_impl_destroy_exec_path_map_cb_iterate,0);
  set_destroy(impl->exec_path_map);
  context_destroy(impl->ctx);
  if (impl->options != (value)0x0) {
    value_type_destroy();
  }
  free(impl);
  return;
}

Assistant:

void loader_impl_destroy_deallocate(loader_impl impl)
{
	set_iterate(impl->exec_path_map, &loader_impl_destroy_exec_path_map_cb_iterate, NULL);

	set_destroy(impl->exec_path_map);

	context_destroy(impl->ctx);

	if (impl->options != NULL)
	{
		value_type_destroy(impl->options);
	}

	free(impl);
}